

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFileDB.cpp
# Opt level: O2

void __thiscall ObjectFileDB::analyze_functions(ObjectFileDB *this)

{
  vector<std::vector<Function,_std::allocator<Function>_>,_std::allocator<std::vector<Function,_std::allocator<Function>_>_>_>
  *this_00;
  key_type *pkVar1;
  pointer pOVar2;
  pointer pFVar3;
  Function *this_01;
  Config *pCVar4;
  mapped_type *pmVar5;
  reference pvVar6;
  pointer pOVar7;
  char *__function;
  key_type *pkVar8;
  ulong uVar9;
  size_type __n;
  uint uVar10;
  pointer func;
  Timer timer;
  _Vector_base<BasicBlock,_std::allocator<BasicBlock>_> local_48;
  
  puts("- Analyzing Functions...");
  Timer::Timer(&timer);
  pCVar4 = get_config();
  if (pCVar4->find_basic_blocks == true) {
    Timer::start(&timer);
    pkVar1 = (this->obj_file_order).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pkVar8 = (this->obj_file_order).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->obj_files_by_name)._M_h._M_element_count != (long)pkVar1 - (long)pkVar8 >> 5) {
      __function = 
      "void ObjectFileDB::for_each_obj(Func) [Func = (lambda at /workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/ObjectFileDB.h:77:18)]"
      ;
      goto LAB_00130fe0;
    }
    uVar10 = 0;
    for (; pkVar8 != pkVar1; pkVar8 = pkVar8 + 1) {
      pmVar5 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     *)this,pkVar8);
      pOVar2 = (pmVar5->super__Vector_base<ObjectFileData,_std::allocator<ObjectFileData>_>)._M_impl
               .super__Vector_impl_data._M_finish;
      for (pOVar7 = (pmVar5->super__Vector_base<ObjectFileData,_std::allocator<ObjectFileData>_>).
                    _M_impl.super__Vector_impl_data._M_start; pOVar7 != pOVar2; pOVar7 = pOVar7 + 1)
      {
        for (__n = 0; (long)__n < (long)(pOVar7->linked_data).segments; __n = __n + 1) {
          pvVar6 = std::
                   vector<std::vector<Function,_std::allocator<Function>_>,_std::allocator<std::vector<Function,_std::allocator<Function>_>_>_>
                   ::at(&(pOVar7->linked_data).functions_by_seg,__n);
          pFVar3 = (pvVar6->super__Vector_base<Function,_std::allocator<Function>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          for (func = (pvVar6->super__Vector_base<Function,_std::allocator<Function>_>)._M_impl.
                      super__Vector_impl_data._M_start; func != pFVar3; func = func + 1) {
            find_blocks_in_function
                      ((vector<BasicBlock,_std::allocator<BasicBlock>_> *)&local_48,
                       &pOVar7->linked_data,(int)__n,func);
            uVar9 = (long)local_48._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_48._M_impl.super__Vector_impl_data._M_start;
            std::vector<BasicBlock,_std::allocator<BasicBlock>_>::operator=
                      (&func->basic_blocks,
                       (vector<BasicBlock,_std::allocator<BasicBlock>_> *)&local_48);
            Function::analyze_prologue(func,&pOVar7->linked_data);
            uVar10 = uVar10 + (int)(uVar9 >> 3);
            std::_Vector_base<BasicBlock,_std::allocator<BasicBlock>_>::~_Vector_base(&local_48);
          }
        }
      }
    }
    Timer::getMs(&timer);
    printf("Found %d basic blocks in %.3f ms\n",(ulong)uVar10);
  }
  Timer::start(&timer);
  pkVar1 = (this->obj_file_order).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pkVar8 = (this->obj_file_order).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->obj_files_by_name)._M_h._M_element_count == (long)pkVar1 - (long)pkVar8 >> 5) {
    do {
      if (pkVar8 == pkVar1) {
        return;
      }
      pmVar5 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     *)this,pkVar8);
      pOVar2 = (pmVar5->super__Vector_base<ObjectFileData,_std::allocator<ObjectFileData>_>)._M_impl
               .super__Vector_impl_data._M_finish;
      for (pOVar7 = (pmVar5->super__Vector_base<ObjectFileData,_std::allocator<ObjectFileData>_>).
                    _M_impl.super__Vector_impl_data._M_start; pOVar7 != pOVar2; pOVar7 = pOVar7 + 1)
      {
        if ((pOVar7->linked_data).segments == 3) {
          this_00 = &(pOVar7->linked_data).functions_by_seg;
          pvVar6 = std::
                   vector<std::vector<Function,_std::allocator<Function>_>,_std::allocator<std::vector<Function,_std::allocator<Function>_>_>_>
                   ::at(this_00,2);
          if ((long)(pvVar6->super__Vector_base<Function,_std::allocator<Function>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(pvVar6->super__Vector_base<Function,_std::allocator<Function>_>)._M_impl.
                    super__Vector_impl_data._M_start != 0xd8) {
            __assert_fail("data.linked_data.functions_by_seg.at(2).size() == 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/ObjectFileDB.cpp"
                          ,0x19e,
                          "auto ObjectFileDB::analyze_functions()::(anonymous class)::operator()(ObjectFileData &) const"
                         );
          }
          pvVar6 = std::
                   vector<std::vector<Function,_std::allocator<Function>_>,_std::allocator<std::vector<Function,_std::allocator<Function>_>_>_>
                   ::at(this_00,2);
          this_01 = (pvVar6->super__Vector_base<Function,_std::allocator<Function>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          if ((this_01->guessed_name)._M_string_length != 0) {
            __assert_fail("func.guessed_name.empty()",
                          "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/ObjectFileDB.cpp"
                          ,0x1a1,
                          "auto ObjectFileDB::analyze_functions()::(anonymous class)::operator()(ObjectFileData &) const"
                         );
          }
          std::__cxx11::string::assign((char *)&this_01->guessed_name);
          Function::find_global_function_defs(this_01,&pOVar7->linked_data);
        }
      }
      pkVar8 = pkVar8 + 1;
    } while( true );
  }
  __function = 
  "void ObjectFileDB::for_each_obj(Func) [Func = (lambda at /workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/ObjectFileDB.cpp:411:18)]"
  ;
LAB_00130fe0:
  __assert_fail("obj_files_by_name.size() == obj_file_order.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/ObjectFileDB.h"
                ,0x3e,__function);
}

Assistant:

void ObjectFileDB::analyze_functions() {
  printf("- Analyzing Functions...\n");
  Timer timer;

  if (get_config().find_basic_blocks) {
    timer.start();
    int total_basic_blocks = 0;
    for_each_function([&](Function& func, int segment_id, ObjectFileData& data) {
      auto blocks = find_blocks_in_function(data.linked_data, segment_id, func);
      total_basic_blocks += blocks.size();
      func.basic_blocks = blocks;
      func.analyze_prologue(data.linked_data);
    });

    printf("Found %d basic blocks in %.3f ms\n", total_basic_blocks, timer.getMs());
  }

  {
    timer.start();
    for_each_obj([&](ObjectFileData& data) {
      if(data.linked_data.segments == 3) {
        // the top level segment should have a single function
        assert(data.linked_data.functions_by_seg.at(2).size() == 1);

        auto& func = data.linked_data.functions_by_seg.at(2).front();
        assert(func.guessed_name.empty());
        func.guessed_name = "(top-level-init)";
        func.find_global_function_defs(data.linked_data);
      }
    });
  }
}